

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::anon_unknown_14::fpToString<float>(float value,int precision)

{
  ostream *this;
  String *this_00;
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  int in_ESI;
  String *in_RDI;
  float in_XMM0_Da;
  size_t i;
  string d;
  ostringstream oss;
  char *in_stack_fffffffffffffde8;
  string local_1e8 [32];
  char *local_1c8;
  string local_1c0 [52];
  int local_18c;
  ostream local_188;
  int local_10;
  float local_c;
  
  local_10 = in_ESI;
  local_c = in_XMM0_Da;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  local_18c = (int)std::setprecision(local_10);
  this = std::operator<<(&local_188,(_Setprecision)local_18c);
  this_00 = (String *)std::ostream::operator<<(this,std::fixed);
  std::ostream::operator<<(this_00,local_c);
  std::__cxx11::ostringstream::str();
  pcVar1 = (char *)std::__cxx11::string::find_last_not_of((char)local_1c0,0x30);
  local_1c8 = pcVar1;
  if (pcVar1 != (char *)0xffffffffffffffff) {
    lVar2 = std::__cxx11::string::size();
    in_stack_fffffffffffffde8 = pcVar1;
    if (pcVar1 != (char *)(lVar2 + -1)) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_1c0);
      if (*pcVar3 == '.') {
        local_1c8 = local_1c8 + 1;
      }
      std::__cxx11::string::substr((ulong)local_1e8,(ulong)local_1c0);
      std::__cxx11::string::operator=(local_1c0,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      in_stack_fffffffffffffde8 = pcVar1;
    }
  }
  std::__cxx11::string::c_str();
  String::String(this_00,in_stack_fffffffffffffde8);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  return in_RDI;
}

Assistant:

String fpToString(T value, int precision) {
        std::ostringstream oss;
        oss << std::setprecision(precision) << std::fixed << value;
        std::string d = oss.str();
        size_t      i = d.find_last_not_of('0');
        if(i != std::string::npos && i != d.size() - 1) {
            if(d[i] == '.')
                i++;
            d = d.substr(0, i + 1);
        }
        return d.c_str();
    }